

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<long_double>::~TPZFileEqnStorage(TPZFileEqnStorage<long_double> *this,void **vtt)

{
  char *__filename;
  undefined8 *in_RSI;
  TPZSavable *in_RDI;
  
  in_RDI->_vptr_TPZSavable = (_func_int **)*in_RSI;
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1cc125b);
  TPZSavable::~TPZSavable(in_RDI,(void **)(in_RSI + 1));
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::~TPZFileEqnStorage()
{
	remove(fFileName.c_str());
}